

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::compareEqual<std::basic_string_view<char,std::char_traits<char>>,char[3]>
               (basic_string_view<char,_std::char_traits<char>_> *lhs,char (*rhs) [3])

{
  size_t __n;
  char *__s1;
  int iVar1;
  size_t sVar2;
  size_type __rlen;
  bool bVar3;
  
  __n = lhs->_M_len;
  __s1 = lhs->_M_str;
  sVar2 = strlen(*rhs);
  if (__n == sVar2) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp(__s1,rhs,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }